

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BitsToFloatCase::BitsToFloatCase
          (BitsToFloatCase *this,TestContext *testCtx,DataType baseType,ShaderType shaderType)

{
  int vecSize;
  DataType basicType;
  char *description;
  ShaderType in_R8D;
  allocator<char> local_99;
  VarType local_98;
  string local_80;
  Symbol local_60;
  
  shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
            (&local_60.name,(_anonymous_namespace_ *)(ulong)baseType,TYPE_FLOAT_VEC2,shaderType,
             in_R8D);
  description = "uintBitsToFloat";
  if (baseType - TYPE_INT < 4) {
    description = "intBitsToFloat";
  }
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,testCtx,local_60.name._M_dataplus._M_p,description,
             shaderType);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_00bdf708;
  vecSize = glu::getDataTypeScalarSize(baseType);
  if (vecSize < 2) {
    basicType = TYPE_FLOAT;
  }
  else {
    basicType = glu::getDataTypeFloatVec(vecSize);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"in0",&local_99);
  glu::VarType::VarType(&local_98,baseType,PRECISION_HIGHP);
  Symbol::Symbol(&local_60,&local_80,&local_98);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.inputs,&local_60);
  Symbol::~Symbol(&local_60);
  glu::VarType::~VarType(&local_98);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"out0",&local_99);
  glu::VarType::VarType(&local_98,basicType,PRECISION_HIGHP);
  Symbol::Symbol(&local_60,&local_80,&local_98);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.outputs,&local_60);
  Symbol::~Symbol(&local_60);
  glu::VarType::~VarType(&local_98);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::assign((char *)&(this->super_CommonFunctionCase).m_spec.source);
  return;
}

Assistant:

BitsToFloatCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::ShaderType shaderType)
		: CommonFunctionCase	(testCtx, getCommonFuncCaseName(baseType, glu::PRECISION_HIGHP, shaderType).c_str(), glu::isDataTypeIntOrIVec(baseType) ? "intBitsToFloat" : "uintBitsToFloat", shaderType)
	{
		const bool			inIsSigned	= glu::isDataTypeIntOrIVec(baseType);
		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	floatType	= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;

		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(floatType, glu::PRECISION_HIGHP)));
		m_spec.source = inIsSigned ? "out0 = intBitsToFloat(in0);" : "out0 = uintBitsToFloat(in0);";
	}